

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtIsConst0(word *pIn1,int nWords)

{
  word *pwVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar3 = uVar2;
  }
  do {
    if (uVar3 == uVar2) {
      return 1;
    }
    pwVar1 = pIn1 + uVar2;
    uVar2 = uVar2 + 1;
  } while (*pwVar1 == 0);
  return 0;
}

Assistant:

static inline int Abc_TtIsConst0( word * pIn1, int nWords )
{
    int w;
    for ( w = 0; w < nWords; w++ )
        if ( pIn1[w] )
            return 0;
    return 1;
}